

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O2

Status __thiscall leveldb::DBImpl::Write(DBImpl *this,WriteOptions *options,WriteBatch *updates)

{
  pthread_mutex_t *__mutex;
  Writer *this_00;
  long lVar1;
  WritableFile *pWVar2;
  Writer *pWVar3;
  int iVar4;
  MemTable *memtable;
  long in_RCX;
  undefined8 uVar5;
  bool bVar6;
  Writer *last_writer;
  Writer w;
  WriteBatch local_a8;
  undefined1 local_88 [8];
  Writer local_80;
  
  __mutex = (pthread_mutex_t *)(options + 200);
  this_00 = (Writer *)(local_88 + 8);
  Writer::Writer(this_00,(Mutex *)&__mutex->__data);
  local_80.sync = *(bool *)&(updates->rep_)._M_dataplus._M_p;
  local_80.done = false;
  std::mutex::lock((mutex *)&__mutex->__data);
  local_a8.rep_._M_dataplus._M_p = (pointer)this_00;
  local_a8.rep_.field_2._8_8_ = updates;
  std::deque<leveldb::DBImpl::Writer*,std::allocator<leveldb::DBImpl::Writer*>>::
  emplace_back<leveldb::DBImpl::Writer*>
            ((deque<leveldb::DBImpl::Writer*,std::allocator<leveldb::DBImpl::Writer*>> *)
             (options + 0x168),(Writer **)&local_a8);
  while( true ) {
    if (local_80.done != false) goto LAB_001102a3;
    if (this_00 == (Writer *)**(undefined8 **)(options + 0x178)) break;
    port::CondVar::Wait(&local_80.cv);
  }
  MakeRoomForWrite(this,SUB81(options,0));
  lVar1 = *(long *)(*(long *)(options + 0x228) + 0x58);
  uVar5 = this_00;
  local_a8.rep_.field_2._M_allocated_capacity = (size_type)this_00;
  if ((in_RCX != 0) && ((this->super_DB)._vptr_DB == (_func_int **)0x0)) {
    memtable = (MemTable *)
               BuildBatchGroup((DBImpl *)options,
                               (Writer **)&local_a8.rep_.field_2._M_allocated_capacity);
    WriteBatchInternal::SetSequence((WriteBatch *)memtable,lVar1 + 1);
    iVar4 = WriteBatchInternal::Count((WriteBatch *)memtable);
    pthread_mutex_unlock(__mutex);
    local_a8.rep_._M_dataplus._M_p =
         (pointer)(memtable->comparator_).comparator.super_Comparator._vptr_Comparator;
    local_a8.rep_._M_string_length = (size_type)(memtable->comparator_).comparator.user_comparator_;
    log::Writer::AddRecord((Writer *)local_88,*(Slice **)(options + 0x158));
    pWVar2 = (WritableFile *)(this->super_DB)._vptr_DB;
    (this->super_DB)._vptr_DB = (_func_int **)local_88;
    local_88 = (undefined1  [8])pWVar2;
    Status::~Status((Status *)local_88);
    if ((this->super_DB)._vptr_DB == (_func_int **)0x0) {
      if (*(char *)local_a8.rep_.field_2._8_8_ == '\x01') {
        (**(code **)(**(long **)(options + 0x148) + 0x28))(&local_a8);
        pWVar3 = (Writer *)(this->super_DB)._vptr_DB;
        (this->super_DB)._vptr_DB = (_func_int **)local_a8.rep_._M_dataplus._M_p;
        local_a8.rep_._M_dataplus._M_p = (pointer)pWVar3;
        Status::~Status((Status *)&local_a8);
        bVar6 = (this->super_DB)._vptr_DB != (_func_int **)0x0;
        if (bVar6) goto LAB_001103db;
      }
      else {
        bVar6 = false;
      }
      WriteBatchInternal::InsertInto(&local_a8,memtable);
      pWVar3 = (Writer *)(this->super_DB)._vptr_DB;
      (this->super_DB)._vptr_DB = (_func_int **)local_a8.rep_._M_dataplus._M_p;
      local_a8.rep_._M_dataplus._M_p = (pointer)pWVar3;
      Status::~Status((Status *)&local_a8);
    }
    else {
      bVar6 = false;
    }
LAB_001103db:
    std::mutex::lock((mutex *)&__mutex->__data);
    if (bVar6) {
      RecordBackgroundError((DBImpl *)options,(Status *)this);
    }
    if (memtable == *(MemTable **)(options + 0x1b8)) {
      WriteBatch::Clear((WriteBatch *)*(MemTable **)(options + 0x1b8));
    }
    VersionSet::SetLastSequence(*(VersionSet **)(options + 0x228),lVar1 + iVar4);
    uVar5 = local_a8.rep_.field_2._M_allocated_capacity;
  }
  do {
    pWVar3 = (Writer *)**(undefined8 **)(options + 0x178);
    std::deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>::pop_front
              ((deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_> *)
               (options + 0x168));
    if (pWVar3 != this_00) {
      Status::operator=((Status *)pWVar3,(Status *)this);
      pWVar3->done = true;
      std::condition_variable::notify_one();
    }
  } while (pWVar3 != (Writer *)uVar5);
  if (*(long *)(options + 0x198) != *(long *)(options + 0x178)) {
    std::condition_variable::notify_one();
  }
LAB_00110473:
  pthread_mutex_unlock(__mutex);
  Writer::~Writer((Writer *)(local_88 + 8));
  return (Status)(char *)this;
LAB_001102a3:
  Status::Status((Status *)this,(Status *)(local_88 + 8));
  goto LAB_00110473;
}

Assistant:

Status DBImpl::Write(const WriteOptions& options, WriteBatch* updates) {
  Writer w(&mutex_);
  w.batch = updates;
  w.sync = options.sync;
  w.done = false;

  MutexLock l(&mutex_);
  writers_.push_back(&w);
  while (!w.done && &w != writers_.front()) {
    w.cv.Wait();
  }
  if (w.done) {
    return w.status;
  }

  // May temporarily unlock and wait.
  Status status = MakeRoomForWrite(updates == nullptr);
  uint64_t last_sequence = versions_->LastSequence();
  Writer* last_writer = &w;
  if (status.ok() && updates != nullptr) {  // nullptr batch is for compactions
    WriteBatch* updates = BuildBatchGroup(&last_writer);
    WriteBatchInternal::SetSequence(updates, last_sequence + 1);
    last_sequence += WriteBatchInternal::Count(updates);

    // Add to log and apply to memtable.  We can release the lock
    // during this phase since &w is currently responsible for logging
    // and protects against concurrent loggers and concurrent writes
    // into mem_.
    {
      mutex_.Unlock();
      status = log_->AddRecord(WriteBatchInternal::Contents(updates));
      bool sync_error = false;
      if (status.ok() && options.sync) {
        status = logfile_->Sync();
        if (!status.ok()) {
          sync_error = true;
        }
      }
      if (status.ok()) {
        status = WriteBatchInternal::InsertInto(updates, mem_);
      }
      mutex_.Lock();
      if (sync_error) {
        // The state of the log file is indeterminate: the log record we
        // just added may or may not show up when the DB is re-opened.
        // So we force the DB into a mode where all future writes fail.
        RecordBackgroundError(status);
      }
    }
    if (updates == tmp_batch_) tmp_batch_->Clear();

    versions_->SetLastSequence(last_sequence);
  }

  while (true) {
    Writer* ready = writers_.front();
    writers_.pop_front();
    if (ready != &w) {
      ready->status = status;
      ready->done = true;
      ready->cv.Signal();
    }
    if (ready == last_writer) break;
  }

  // Notify new head of write queue
  if (!writers_.empty()) {
    writers_.front()->cv.Signal();
  }

  return status;
}